

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O3

void __thiscall
Transaction_RollbackAfterFillingRegion_Test::TestBody
          (Transaction_RollbackAfterFillingRegion_Test *this)

{
  mock_database *db;
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer *__ptr;
  char *pcVar4;
  mock_mutex mutex;
  uint64_t original_size;
  transaction<std::unique_lock<mock_mutex>_> t1;
  size_t original_num_regions;
  unique_lock<mock_mutex> local_98;
  AssertHelper local_88;
  mutex_type local_79;
  AssertHelper local_78;
  undefined1 local_70 [8];
  database *local_68;
  unsigned_long local_38;
  
  db = &(this->super_Transaction).db_;
  peVar1 = (this->super_Transaction).db_.super_database.storage_.file_.
           super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38 = (long)(this->super_Transaction).db_.super_database.storage_.regions_.
                   super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_Transaction).db_.super_database.storage_.regions_.
                   super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_98._M_owns = false;
  local_98._M_device = &local_79;
  std::unique_lock<mock_mutex>::lock(&local_98);
  local_98._M_owns = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_70,&db->super_database,&local_98);
  peVar2 = (this->super_Transaction).db_.super_database.storage_.regions_.
           super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pstore::transaction_base::allocate
            ((transaction_base *)local_70,
             ((peVar2->offset_ + peVar2->size_) -
             (this->super_Transaction).db_.super_database.size_.logical_) - 0x70,1);
  pstore::transaction_base::commit((transaction_base *)local_70);
  local_70 = (undefined1  [8])&PTR__transaction_0026b340;
  pstore::transaction_base::rollback((transaction_base *)local_70);
  local_98._M_device =
       (mutex_type *)
       ((long)(this->super_Transaction).db_.super_database.storage_.regions_.
              super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->super_Transaction).db_.super_database.storage_.regions_.
              super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_70,"regions.size ()","original_num_regions",
             (unsigned_long *)&local_98,&local_38);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_98._M_device + 0x10),
               "Expected the first allocate to fill the initial region",0x36);
    if (local_68 == (database *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&local_68->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x177,pcVar4);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_98._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_98._M_device + 8))();
    }
  }
  if (local_68 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  }
  iVar3 = (*peVar1->_vptr_file_base[9])(peVar1);
  local_78.data_ = (AssertHelperData *)CONCAT44(extraout_var,iVar3);
  local_98._M_owns = false;
  local_98._M_device = &local_79;
  std::unique_lock<mock_mutex>::lock(&local_98);
  local_98._M_owns = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_70,&db->super_database,&local_98);
  pstore::transaction_base::allocate((transaction_base *)local_70,4,1);
  pstore::transaction_base::rollback((transaction_base *)local_70);
  local_70 = (undefined1  [8])&PTR__transaction_0026b340;
  pstore::transaction_base::rollback((transaction_base *)local_70);
  local_98._M_device =
       (mutex_type *)
       ((long)(this->super_Transaction).db_.super_database.storage_.regions_.
              super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->super_Transaction).db_.super_database.storage_.regions_.
              super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_70,"regions.size ()","original_num_regions",
             (unsigned_long *)&local_98,&local_38);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_98._M_device + 0x10),"Rollback did not reclaim regions",0x20);
    if (local_68 == (database *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&local_68->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x180,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_98._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_98._M_device + 8))();
    }
  }
  if (local_68 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  }
  iVar3 = (*peVar1->_vptr_file_base[9])(peVar1);
  local_98._M_device = (mutex_type *)CONCAT44(extraout_var_00,iVar3);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_70,"file->size ()","original_size",(unsigned_long *)&local_98,
             (unsigned_long *)&local_78);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_98._M_device + 0x10),
               "The file was not restored to its original size",0x2e);
    if (local_68 == (database *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)&local_68->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x181,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_98._M_device != (mutex_type *)0x0) {
      (**(code **)(*(long *)local_98._M_device + 8))();
    }
  }
  if (local_68 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  }
  return;
}

Assistant:

TEST_F (Transaction, RollbackAfterFillingRegion) {
    pstore::storage::region_container const & regions = db_.storage ().regions ();
    pstore::file::file_base * const file = db_.storage ().file ();
    std::size_t const original_num_regions = regions.size ();
    constexpr auto align = 1U;

    mock_mutex mutex;
    using guard_type = std::unique_lock<mock_mutex>;

    {
        auto t1 = begin (db_, guard_type{mutex});
        t1.allocate (regions.back ()->end () - db_.size () - sizeof (pstore::trailer), align);
        t1.commit ();
    }
    EXPECT_EQ (regions.size (), original_num_regions)
        << "Expected the first allocate to fill the initial region";

    std::uint64_t const original_size = file->size ();
    {
        auto t2 = begin (db_, guard_type{mutex});
        t2.allocate (sizeof (int), align);
        t2.rollback ();
    }
    EXPECT_EQ (regions.size (), original_num_regions) << "Rollback did not reclaim regions";
    EXPECT_EQ (file->size (), original_size) << "The file was not restored to its original size";
}